

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O1

int cbb_add_u(CBB *cbb,uint64_t v,size_t len_len)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  anon_union_32_2_4f6aaa2e_for_u *paVar4;
  uint8_t *buf;
  uint8_t *local_20;
  
  iVar1 = CBB_add_space(cbb,&local_20,len_len);
  iVar2 = 0;
  if (iVar1 != 0) {
    if (len_len != 0) {
      uVar3 = len_len - 1;
      do {
        local_20[uVar3] = (uint8_t)v;
        v = v >> 8;
        uVar3 = uVar3 - 1;
      } while (uVar3 < len_len);
    }
    if (v == 0) {
      iVar2 = 1;
    }
    else {
      paVar4 = &cbb->u;
      if (cbb->is_child != '\0') {
        paVar4 = (anon_union_32_2_4f6aaa2e_for_u *)(paVar4->base).buf;
      }
      *(byte *)((long)paVar4 + 0x18) = *(byte *)((long)paVar4 + 0x18) | 2;
      cbb->child = (CBB *)0x0;
    }
  }
  return iVar2;
}

Assistant:

static int cbb_add_u(CBB *cbb, uint64_t v, size_t len_len) {
  uint8_t *buf;
  if (!CBB_add_space(cbb, &buf, len_len)) {
    return 0;
  }

  for (size_t i = len_len - 1; i < len_len; i--) {
    buf[i] = v;
    v >>= 8;
  }

  // |v| must fit in |len_len| bytes.
  if (v != 0) {
    cbb_on_error(cbb);
    return 0;
  }

  return 1;
}